

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O3

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  undefined8 *in_RDI;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  Matrix2f MVar10;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  uVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    auVar9 = ZEXT464(*(uint *)((long)in_RDI + uVar5 * 4));
    auVar8 = ZEXT464(*(uint *)((long)in_RDI + uVar5 * 4 + 8));
    lVar6 = 0;
    bVar3 = true;
    do {
      bVar7 = bVar3;
      auVar1 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)x->m_elements[lVar6 * 2 + uVar5]),
                               ZEXT416((uint)y->m_elements[lVar6]));
      auVar9 = ZEXT1664(auVar1);
      auVar2 = vfmadd231ss_fma(auVar8._0_16_,ZEXT416((uint)x->m_elements[lVar6 * 2 + uVar5]),
                               ZEXT416((uint)y->m_elements[lVar6 + 2]));
      auVar8 = ZEXT1664(auVar2);
      lVar6 = 1;
      bVar3 = false;
    } while (bVar7);
    *(int *)((long)in_RDI + uVar5 * 4) = auVar1._0_4_;
    *(int *)((long)in_RDI + (uVar5 | 2) * 4) = auVar2._0_4_;
    uVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  MVar10.m_elements._0_8_ = auVar2._0_8_;
  MVar10.m_elements._8_8_ = auVar1._0_8_;
  return (Matrix2f)MVar10.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}